

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O3

void listelem_add_block(listelem_alloc_t *list,char *caller_file,int caller_line)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char **ptr;
  glist_t pgVar3;
  long lVar4;
  size_t sVar5;
  int val;
  size_t n_elem;
  ulong uVar6;
  char **ppcVar7;
  
  if (list->blocksize == (glist_t)0x0) {
    val = 0x32;
  }
  else {
    val = *(int *)&list->blocksize->data;
  }
  if (list->blk_alloc == 0) {
    val = val * 2;
    n_elem = (size_t)val;
    sVar5 = list->elemsize;
    uVar6 = sVar5 * n_elem;
    if (0x40000 < uVar6) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar5;
      auVar1 = (ZEXT416(0) << 0x40 | ZEXT816(0x40000)) / auVar1;
      n_elem = auVar1._0_8_;
      uVar6 = n_elem * sVar5;
      val = auVar1._0_4_;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    list->blk_alloc = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40000)) / auVar2,0);
  }
  else {
    sVar5 = list->elemsize;
    n_elem = (size_t)val;
  }
  ptr = (char **)__ckd_calloc__(n_elem,sVar5,caller_file,caller_line);
  list->freelist = ptr;
  pgVar3 = glist_add_ptr(list->blocks,ptr);
  list->blocks = pgVar3;
  pgVar3 = glist_add_int32(list->blocksize,val);
  list->blocksize = pgVar3;
  if (val + -1 != 0) {
    lVar4 = (long)(val + -1);
    sVar5 = list->elemsize;
    ppcVar7 = ptr;
    do {
      ptr = (char **)((long)ppcVar7 + sVar5);
      *ppcVar7 = (char *)ptr;
      lVar4 = lVar4 + -1;
      ppcVar7 = ptr;
    } while (lVar4 != 0);
  }
  *ptr = (char *)0x0;
  list->blk_alloc = list->blk_alloc - 1;
  list->n_blocks = list->n_blocks + 1;
  return;
}

Assistant:

static void
listelem_add_block(listelem_alloc_t *list, char *caller_file, int caller_line)
{
    char **cpp, *cp;
    size_t j;
    int32 blocksize;

    blocksize = list->blocksize ? gnode_int32(list->blocksize) : MIN_ALLOC;
    /* Check if block size should be increased (if many requests for this size) */
    if (list->blk_alloc == 0) {
        /* See above.  No sense in allocating blocks bigger than
         * 256KiB (well, actually, there might be, but we'll worry
         * about that later). */
	blocksize <<= 1;
        if (blocksize * list->elemsize > (1 << 18))
            blocksize = (1 << 18) / list->elemsize;
	list->blk_alloc = (1 << 18) / (blocksize * list->elemsize);
    }

    /* Allocate block */
    cpp = list->freelist =
	(char **) __ckd_calloc__(blocksize, list->elemsize,
				 caller_file, caller_line);
    list->blocks = glist_add_ptr(list->blocks, cpp);
    list->blocksize = glist_add_int32(list->blocksize, blocksize);
    cp = (char *) cpp;
    /* Link up the blocks via their first machine word. */
    for (j = blocksize - 1; j > 0; --j) {
	cp += list->elemsize;
	*cpp = cp;
	cpp = (char **) cp;
    }
    /* Make sure the last element's forward pointer is NULL */
    *cpp = NULL;
    --list->blk_alloc;
    ++list->n_blocks;
}